

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compilation.cpp
# Opt level: O3

void __thiscall
ExchangeCompilation_MissingTriple_Test::~ExchangeCompilation_MissingTriple_Test
          (ExchangeCompilation_MissingTriple_Test *this)

{
  (this->super_ExchangeCompilation).super_Test._vptr_Test =
       (_func_int **)&PTR__ExchangeCompilation_002344f8;
  pstore::database::~database(&(this->super_ExchangeCompilation).import_db_);
  in_memory_store::~in_memory_store(&(this->super_ExchangeCompilation).import_store_);
  pstore::database::~database(&(this->super_ExchangeCompilation).export_db_);
  in_memory_store::~in_memory_store(&(this->super_ExchangeCompilation).export_store_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x290);
  return;
}

Assistant:

TEST_F (ExchangeCompilation, MissingTriple) {
    auto const compilation = R"({ "definitions": [] })"s;
    constexpr auto compilation_digest = pstore::index::digest{0x12345678, 0x9ABCDEF0};

    pstore::exchange::import_ns::string_mapping imported_names;

    mock_mutex mutex;
    auto transaction = begin (import_db_, transaction_lock{mutex});

    auto const fragment_index =
        pstore::index::get_index<pstore::trailer::indices::fragment> (import_db_);
    auto compilation_parser = import_compilation_parser (&transaction, &imported_names,
                                                         fragment_index, compilation_digest);
    compilation_parser.input (compilation).eof ();
    EXPECT_EQ (compilation_parser.last_error (),
               make_error_code (pstore::exchange::import_ns::error::incomplete_compilation_object));

    transaction.commit ();
}